

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O2

uint __thiscall
Js::EntryPointInfo::PopulateLineInfo(EntryPointInfo *this,void *pInfo,FunctionBody *body)

{
  uint statementIndex;
  ULONG UVar1;
  ULONG UVar2;
  NativeEntryPointData *pNVar3;
  Type *pTVar4;
  uint uVar5;
  int index;
  int iVar6;
  
  pNVar3 = GetNativeEntryPointData(this);
  UVar1 = ParseableFunctionInfo::GetLineNumber(&body->super_ParseableFunctionInfo);
  *(undefined4 *)pInfo = 0;
  *(ULONG *)((long)pInfo + 4) = UVar1;
  iVar6 = (pNVar3->nativeOffsetMaps).
          super_ReadOnlyList<NativeEntryPointData::NativeOffsetMap,_Memory::HeapAllocator,_DefaultComparer>
          .count;
  index = 0;
  if (iVar6 < 1) {
    iVar6 = 0;
  }
  uVar5 = 1;
  for (; iVar6 != index; index = index + 1) {
    pTVar4 = JsUtil::
             List<NativeEntryPointData::NativeOffsetMap,_Memory::HeapAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
             ::Item(&pNVar3->nativeOffsetMaps,index);
    statementIndex = pTVar4->statementIndex;
    if (statementIndex == 0) {
      *(Type *)((long)pInfo + (long)(int)uVar5 * 8) = (pTVar4->nativeOffsetSpan).begin;
      *(ULONG *)((long)pInfo + (long)(int)uVar5 * 8 + 4) = UVar1;
      uVar5 = uVar5 + 1;
    }
    UVar2 = FunctionBody::GetSourceLineNumber(body,statementIndex);
    if (UVar2 != 0) {
      *(Type *)((long)pInfo + (long)(int)uVar5 * 8) = (pTVar4->nativeOffsetSpan).end;
      *(ULONG *)((long)pInfo + (long)(int)uVar5 * 8 + 4) = UVar2;
      uVar5 = uVar5 + 1;
    }
  }
  return uVar5;
}

Assistant:

uint EntryPointInfo::PopulateLineInfo(void* pInfo, FunctionBody* body)
    {
        auto& nativeOffsetMaps = this->GetNativeEntryPointData()->GetNativeOffsetMaps();
        LineNumberInfo* pLineInfo = (LineNumberInfo*)pInfo;
        ULONG functionLineNumber = body->GetLineNumber();
        pLineInfo[0].Offset = 0;
        pLineInfo[0].LineNumber = functionLineNumber;

        int lineNumber = 0;
        int j = 1; // start with 1 since offset 0 has already been populated with function line number
        int count = nativeOffsetMaps.Count();
        for(int i = 0; i < count; i++)
        {
            const NativeEntryPointData::NativeOffsetMap* map = &nativeOffsetMaps.Item(i);
            uint32 statementIndex = map->statementIndex;
            if (statementIndex == 0)
            {
                // statementIndex is 0, first line in the function, populate with function line number
                pLineInfo[j].Offset = map->nativeOffsetSpan.begin;
                pLineInfo[j].LineNumber = functionLineNumber;
                j++;
            }

            lineNumber = body->GetSourceLineNumber(statementIndex);
            if (lineNumber != 0)
            {
                pLineInfo[j].Offset = map->nativeOffsetSpan.end;
                pLineInfo[j].LineNumber = lineNumber;
                j++;
            }
        }

        return j;
    }